

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall wasm::WasmBinaryBuilder::readDylink(WasmBinaryBuilder *this,size_t payloadLen)

{
  size_t sVar1;
  _Head_base<0UL,_wasm::DylinkSection_*,_false> _Var2;
  undefined1 auVar3 [16];
  uint32_t uVar4;
  ulong uVar5;
  bool bVar6;
  string local_68;
  string_view local_48;
  size_t local_38;
  
  local_38 = payloadLen;
  std::make_unique<wasm::DylinkSection>();
  sVar1 = local_48._M_len;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_48._M_str;
  local_48 = (string_view)(auVar3 << 0x40);
  std::__uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>::reset
            ((__uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_> *)
             &this->wasm->dylinkSection,(pointer)sVar1);
  std::unique_ptr<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>::~unique_ptr
            ((unique_ptr<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_> *)&local_48
            );
  sVar1 = this->pos;
  ((this->wasm->dylinkSection)._M_t.
   super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>._M_t.
   super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>.
   super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl)->isLegacy = true;
  uVar4 = getU32LEB(this);
  ((this->wasm->dylinkSection)._M_t.
   super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>._M_t.
   super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>.
   super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl)->memorySize = uVar4;
  uVar4 = getU32LEB(this);
  ((this->wasm->dylinkSection)._M_t.
   super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>._M_t.
   super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>.
   super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl)->memoryAlignment = uVar4;
  uVar4 = getU32LEB(this);
  ((this->wasm->dylinkSection)._M_t.
   super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>._M_t.
   super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>.
   super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl)->tableSize = uVar4;
  uVar4 = getU32LEB(this);
  ((this->wasm->dylinkSection)._M_t.
   super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>._M_t.
   super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>.
   super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl)->tableAlignment = uVar4;
  uVar4 = getU32LEB(this);
  uVar5 = (ulong)uVar4;
  while (bVar6 = uVar5 != 0, uVar5 = uVar5 - 1, bVar6) {
    _Var2._M_head_impl =
         (this->wasm->dylinkSection)._M_t.
         super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>._M_t.
         super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>.
         super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl;
    local_48 = (string_view)getInlineString(this);
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::emplace_back<wasm::Name>
              (&(_Var2._M_head_impl)->neededDynlibs,(Name *)&local_48);
  }
  if (this->pos == sVar1 + local_38) {
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"bad dylink section size",(allocator<char> *)&local_48);
  throwError(this,&local_68);
}

Assistant:

void WasmBinaryBuilder::readDylink(size_t payloadLen) {
  wasm.dylinkSection = std::make_unique<DylinkSection>();

  auto sectionPos = pos;

  wasm.dylinkSection->isLegacy = true;
  wasm.dylinkSection->memorySize = getU32LEB();
  wasm.dylinkSection->memoryAlignment = getU32LEB();
  wasm.dylinkSection->tableSize = getU32LEB();
  wasm.dylinkSection->tableAlignment = getU32LEB();

  size_t numNeededDynlibs = getU32LEB();
  for (size_t i = 0; i < numNeededDynlibs; ++i) {
    wasm.dylinkSection->neededDynlibs.push_back(getInlineString());
  }

  if (pos != sectionPos + payloadLen) {
    throwError("bad dylink section size");
  }
}